

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void av1_prune_partitions_before_search
               (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,
               PartitionSearchState *part_state)

{
  BLOCK_SIZE BVar1;
  _Bool _Var2;
  int iVar3;
  AV1_COMMON *cm_00;
  PartitionSearchState *in_RCX;
  long in_RSI;
  long in_RDI;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int try_prune_rect;
  int rect_part_allowed;
  int non_rect_part_allowed;
  int try_split_only;
  int try_intra_cnn_based_part_prune;
  int prune_sub_8x8;
  MACROBLOCKD *xd;
  BLOCK_SIZE max_prune_bsize;
  SIMPLE_MOTION_DATA_TREE *in_stack_00000040;
  int max_bsize;
  int sqr_bsize_step;
  BLOCK_SIZE bsize;
  PartitionBlkParams *blk_params;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  PartitionSearchState *in_stack_000000a8;
  SIMPLE_MOTION_DATA_TREE *in_stack_000000b0;
  MACROBLOCK *in_stack_000000b8;
  AV1_COMP *in_stack_000000c0;
  PartitionSearchState *in_stack_000004c8;
  int in_stack_000004d0;
  int in_stack_000004d4;
  MACROBLOCK *in_stack_000004d8;
  AV1_COMMON *in_stack_000004e0;
  _Bool local_73;
  BLOCK_SIZE local_70;
  int local_6c;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  BVar1 = (in_RCX->part_blk_params).bsize;
  if (*(int *)(in_RDI + 0x609b4) < (int)(uint)BVar1) {
    in_RCX->do_rectangular_split = 0;
    in_RCX->partition_rect_allowed[0] = 0;
    in_RCX->partition_rect_allowed[1] = 0;
  }
  if (*(int *)(in_RDI + 0x609bc) == 1) {
    if ((BVar1 == BLOCK_8X8) && (*(int *)(in_RSI + 0x4208) < 0x23)) {
      av1_disable_rect_partitions(in_RCX);
    }
  }
  else if (*(int *)(in_RDI + 0x609bc) == 2) {
    local_6c = ((*(int *)(in_RSI + 0x4208) * 3) / 0x100) * -3 + 9;
    if (local_6c < 1) {
      local_6c = 0;
    }
    if (local_6c < 9) {
      local_70 = (BLOCK_SIZE)local_6c;
    }
    else {
      local_70 = BLOCK_32X32;
    }
    if (BVar1 < local_70) {
      av1_disable_rect_partitions(in_RCX);
    }
  }
  if ((*(int *)(in_RDI + 0x609cc) != 0) && (BVar1 == BLOCK_8X8)) {
    if (*(int *)(in_RDI + 0x609cc) == 2) {
      bVar4 = true;
    }
    else {
      bVar4 = false;
      if ((((*(byte *)(in_RSI + 0x2061) & 1) != 0) &&
          (bVar4 = false, (*(byte *)(in_RSI + 0x2060) & 1) != 0)) &&
         (bVar4 = true, **(byte **)(in_RSI + 0x2068) < 4)) {
        bVar4 = 3 < **(byte **)(in_RSI + 0x2070);
      }
    }
    if (bVar4) {
      av1_disable_all_splits((PartitionSearchState *)0x5b9184);
    }
  }
  iVar3 = frame_is_intra_only(cm_00);
  local_73 = false;
  if (((iVar3 != 0) && (local_73 = false, *(int *)(in_RDI + 0x609a8) != 0)) &&
     ((local_73 = false, 0xb < *(byte *)(*(long *)(in_RDI + 0x42008) + 0x1c) &&
      ((local_73 = false, BVar1 < BLOCK_64X128 &&
       (local_73 = false, (in_RCX->part_blk_params).bsize_at_least_8x8 != 0)))))) {
    local_73 = av1_is_whole_blk_in_frame
                         (&in_RCX->part_blk_params,(CommonModeInfoParams *)(in_RDI + 0x3c188));
  }
  if (local_73 != false) {
    intra_mode_cnn_partition
              (in_stack_000004e0,in_stack_000004d8,in_stack_000004d4,in_stack_000004d0,
               in_stack_000004c8);
  }
  bVar4 = false;
  if (((*(int *)(in_RDI + 0x60998) != 0) && (bVar4 = false, in_RCX->do_square_split != 0)) &&
     (bVar4 = false, (in_RCX->part_blk_params).bsize_at_least_8x8 != 0)) {
    _Var2 = av1_is_whole_blk_in_frame
                      (&in_RCX->part_blk_params,(CommonModeInfoParams *)(in_RDI + 0x3c188));
    bVar4 = false;
    if (_Var2) {
      iVar3 = frame_is_intra_only(cm_00);
      bVar4 = false;
      if (iVar3 == 0) {
        iVar3 = av1_superres_scaled(cm_00);
        bVar4 = iVar3 == 0;
      }
    }
  }
  if (bVar4) {
    simple_motion_search_based_split
              ((AV1_COMP *)blk_params,_sqr_bsize_step,in_stack_00000040,(PartitionSearchState *)xd);
  }
  bVar4 = true;
  if (in_RCX->do_square_split == 0) {
    bVar4 = in_RCX->partition_none_allowed != 0;
  }
  bVar5 = false;
  if (((in_RCX->do_rectangular_split != 0) &&
      ((in_RCX->partition_rect_allowed[0] == 0 || (bVar5 = true, in_RCX->prune_rect_part[0] != 0))))
     && (bVar5 = false, in_RCX->partition_rect_allowed[1] != 0)) {
    bVar5 = in_RCX->prune_rect_part[1] == 0;
  }
  bVar6 = false;
  if (*(int *)(in_RDI + 0x60994) != 0) {
    iVar3 = frame_is_intra_only(cm_00);
    bVar6 = false;
    if (((iVar3 == 0) && (bVar6 = false, bVar4)) && (bVar6 = false, bVar5)) {
      iVar3 = av1_superres_scaled(cm_00);
      bVar6 = iVar3 == 0;
    }
  }
  if (bVar6) {
    simple_motion_search_prune_rect
              (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
  }
  return;
}

Assistant:

void av1_prune_partitions_before_search(AV1_COMP *const cpi,
                                        MACROBLOCK *const x,
                                        SIMPLE_MOTION_DATA_TREE *const sms_tree,
                                        PartitionSearchState *part_state) {
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;

  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const BLOCK_SIZE bsize = blk_params->bsize;

#if CONFIG_THREE_PASS
  if (cpi->third_pass_ctx) {
    int mi_row = blk_params->mi_row;
    int mi_col = blk_params->mi_col;
    double ratio_h, ratio_w;
    av1_get_third_pass_ratio(cpi->third_pass_ctx, 0, cm->height, cm->width,
                             &ratio_h, &ratio_w);
    THIRD_PASS_MI_INFO *this_mi = av1_get_third_pass_mi(
        cpi->third_pass_ctx, 0, mi_row, mi_col, ratio_h, ratio_w);
    BLOCK_SIZE third_pass_bsize =
        av1_get_third_pass_adjusted_blk_size(this_mi, ratio_h, ratio_w);
    // check the actual partition of this block in the second pass
    PARTITION_TYPE third_pass_part =
        av1_third_pass_get_sb_part_type(cpi->third_pass_ctx, this_mi);

    int is_edge = (mi_row + mi_size_high[bsize] >= cm->mi_params.mi_rows) ||
                  (mi_col + mi_size_wide[bsize] >= cm->mi_params.mi_cols);

    if (!is_edge && block_size_wide[bsize] >= 16) {
      // If in second pass we used rectangular partition, then do not search for
      // rectangular partition in the different direction.
      if (third_pass_part != PARTITION_NONE) {
        if (third_pass_part == PARTITION_HORZ ||
            third_pass_part == PARTITION_HORZ_4 ||
            third_pass_part == PARTITION_HORZ_A ||
            third_pass_part == PARTITION_HORZ_B) {
          part_state->partition_rect_allowed[VERT] = 0;
        } else if (third_pass_part == PARTITION_VERT ||
                   third_pass_part == PARTITION_VERT_4 ||
                   third_pass_part == PARTITION_VERT_A ||
                   third_pass_part == PARTITION_VERT_B) {
          part_state->partition_rect_allowed[HORZ] = 0;
        }
      }

      int minSize = AOMMIN(block_size_wide[third_pass_bsize],
                           block_size_high[third_pass_bsize]);
      int maxSize = AOMMAX(block_size_wide[third_pass_bsize],
                           block_size_high[third_pass_bsize]);
      if (block_size_wide[bsize] < minSize / 4) {
        // Current partition is too small, just terminate
        part_state->terminate_partition_search = 1;
        return;
      } else if (block_size_wide[bsize] < minSize / 2) {
        if (third_pass_part != PARTITION_NONE) {
          // Current partition is very small, and in second pass we used
          // rectangular partition. Terminate the search here then.
          part_state->terminate_partition_search = 1;
          return;
        } else {
          // Partition is small, but we still check this partition, only disable
          // further splits.
          // TODO(any): check why this is not covered by the termination for <
          // minSize/4.
          av1_disable_square_split_partition(part_state);
          av1_disable_rect_partitions(part_state);
          return;
        }
      } else if (block_size_wide[bsize] > maxSize) {
        // Partition is larger than in the second pass. Only allow split.
        av1_set_square_split_only(part_state);
        return;
      } else if (block_size_wide[bsize] >= minSize &&
                 block_size_wide[bsize] <= maxSize) {
        // Partition is within a range where it is very likely to find a good
        // choice, so do not prune anything.
        return;
      }
    }
  }
#endif  // CONFIG_THREE_PASS

  // Prune rectangular partitions for larger blocks.
  if (bsize > cpi->sf.part_sf.rect_partition_eval_thresh) {
    part_state->do_rectangular_split = 0;
    part_state->partition_rect_allowed[HORZ] = 0;
    part_state->partition_rect_allowed[VERT] = 0;
  }

  // Prune rectangular, AB and 4-way partition based on q index and block size
  if (cpi->sf.part_sf.prune_rectangular_split_based_on_qidx == 1) {
    if (bsize == BLOCK_8X8 && x->qindex < 35)
      av1_disable_rect_partitions(part_state);

  } else if (cpi->sf.part_sf.prune_rectangular_split_based_on_qidx == 2) {
    // Enumeration difference between two square partitions
    const int sqr_bsize_step = BLOCK_32X32 - BLOCK_16X16;
    int max_bsize =
        BLOCK_32X32 - (x->qindex * 3 / QINDEX_RANGE) * sqr_bsize_step;
    max_bsize = AOMMAX(max_bsize, BLOCK_4X4);
    const BLOCK_SIZE max_prune_bsize =
        (BLOCK_SIZE)AOMMIN(max_bsize, BLOCK_32X32);

    // Prune partition
    // qidx 0 to 85: prune bsize below BLOCK_32X32
    // qidx 86 to 170: prune bsize below BLOCK_16X16
    // qidx 171 to 255: prune bsize below BLOCK_8X8
    if (bsize < max_prune_bsize) {
      av1_disable_rect_partitions(part_state);
    }
  }

  if (cpi->sf.part_sf.prune_sub_8x8_partition_level && (bsize == BLOCK_8X8)) {
    const MACROBLOCKD *const xd = &x->e_mbd;
    int prune_sub_8x8;
    if (cpi->sf.part_sf.prune_sub_8x8_partition_level == 2) {
      prune_sub_8x8 = 1;
    } else {
      assert(cpi->sf.part_sf.prune_sub_8x8_partition_level == 1);
      // Prune if both neighbors are available and either is > BLOCK_8X8
      prune_sub_8x8 = xd->left_available && xd->up_available &&
                      (xd->left_mbmi->bsize > BLOCK_8X8 ||
                       xd->above_mbmi->bsize > BLOCK_8X8);
    }
    if (prune_sub_8x8) {
      av1_disable_all_splits(part_state);
    }
  }

  // A CNN-based speed feature pruning out either split or all non-split
  // partition in INTRA frame coding.
  const int try_intra_cnn_based_part_prune =
      frame_is_intra_only(cm) &&
      cpi->sf.part_sf.intra_cnn_based_part_prune_level &&
      cm->seq_params->sb_size >= BLOCK_64X64 && bsize <= BLOCK_64X64 &&
      blk_params->bsize_at_least_8x8 &&
      av1_is_whole_blk_in_frame(blk_params, mi_params);

  if (try_intra_cnn_based_part_prune) {
    intra_mode_cnn_partition(&cpi->common, x, x->part_search_info.quad_tree_idx,
                             cpi->sf.part_sf.intra_cnn_based_part_prune_level,
                             part_state);
  }

  // Use simple motion search to prune out split or non-split partitions. This
  // must be done prior to PARTITION_SPLIT to propagate the initial mvs to a
  // smaller blocksize.
  const int try_split_only =
      cpi->sf.part_sf.simple_motion_search_split &&
      part_state->do_square_split && blk_params->bsize_at_least_8x8 &&
      av1_is_whole_blk_in_frame(blk_params, mi_params) &&
      !frame_is_intra_only(cm) && !av1_superres_scaled(cm);

  if (try_split_only) {
    simple_motion_search_based_split(cpi, x, sms_tree, part_state);
  }

  // Use simple motion search to prune out rectangular partition in some
  // direction. The results are stored in prune_horz and prune_vert in order to
  // bypass future related pruning checks if a pruning decision has been made.

  // We want to search at least one partition mode, so don't prune if NONE and
  // SPLIT are disabled.
  const int non_rect_part_allowed =
      part_state->do_square_split || part_state->partition_none_allowed;
  // Only run the model if the partitions are not already pruned.
  const int rect_part_allowed = part_state->do_rectangular_split &&
                                ((part_state->partition_rect_allowed[HORZ] &&
                                  !part_state->prune_rect_part[HORZ]) ||
                                 (part_state->partition_rect_allowed[VERT] &&
                                  !part_state->prune_rect_part[VERT]));

  const int try_prune_rect = cpi->sf.part_sf.simple_motion_search_prune_rect &&
                             !frame_is_intra_only(cm) &&
                             non_rect_part_allowed && rect_part_allowed &&
                             !av1_superres_scaled(cm);

  if (try_prune_rect) {
    simple_motion_search_prune_rect(cpi, x, sms_tree, part_state);
  }
}